

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O0

string * ApprovalTests::HelpMessages::getMisconfiguredMainHelp_abi_cxx11_(void)

{
  string *in_RDI;
  string helpMessage;
  string *in_stack_000000a8;
  allocator local_29;
  string local_28 [40];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_28,
             "* Welcome to Approval Tests.\n*\n* You have forgotten to configure your test framework for Approval Tests.\n*\n* To do this in Catch, add the following to your main.cpp:\n*\n*     #define APPROVALS_CATCH\n*     #include \"ApprovalTests.hpp\"\n*\n* To do this in Google Test, add the following to your main.cpp:\n*\n*     #define APPROVALS_GOOGLETEST\n*     #include \"ApprovalTests.hpp\"\n*\n* To do this in doctest, add the following to your main.cpp:\n*\n*     #define APPROVALS_DOCTEST\n*     #include \"ApprovalTests.hpp\"\n*\n* To do this in Boost.Test, add the following to your main.cpp:\n*\n*     #define APPROVALS_BOOSTTEST\n*     #include \"ApprovalTests.hpp\"\n*\n* To do this in CppUTest, add the following to your main.cpp:\n*\n*     #define APPROVALS_CPPUTEST\n*     #include \"ApprovalTests.hpp\"\n*\n* To do this in [Boost].UT, add the following to your main.cpp:\n*\n*     #define APPROVALS_UT\n*     #include \"ApprovalTests.hpp\"\n*\n* For more information, please visit:\n* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/TroubleshootingMisconfiguredMain.md\n"
             ,&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  topAndTailHelpMessage(in_stack_000000a8);
  ::std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string HelpMessages::getMisconfiguredMainHelp()
    {
        std::string helpMessage = R"(* Welcome to Approval Tests.
*
* You have forgotten to configure your test framework for Approval Tests.
*
* To do this in Catch, add the following to your main.cpp:
*
*     #define APPROVALS_CATCH
*     #include "ApprovalTests.hpp"
*
* To do this in Google Test, add the following to your main.cpp:
*
*     #define APPROVALS_GOOGLETEST
*     #include "ApprovalTests.hpp"
*
* To do this in doctest, add the following to your main.cpp:
*
*     #define APPROVALS_DOCTEST
*     #include "ApprovalTests.hpp"
*
* To do this in Boost.Test, add the following to your main.cpp:
*
*     #define APPROVALS_BOOSTTEST
*     #include "ApprovalTests.hpp"
*
* To do this in CppUTest, add the following to your main.cpp:
*
*     #define APPROVALS_CPPUTEST
*     #include "ApprovalTests.hpp"
*
* To do this in [Boost].UT, add the following to your main.cpp:
*
*     #define APPROVALS_UT
*     #include "ApprovalTests.hpp"
*
* For more information, please visit:
* https://github.com/approvals/ApprovalTests.cpp/blob/master/doc/TroubleshootingMisconfiguredMain.md
)";
        return topAndTailHelpMessage(helpMessage);
    }